

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

Err * vm_run_file(VM *vm,char *path)

{
  int pkg_00;
  uint64_t name_00;
  char *code_00;
  Err *err;
  int pkg;
  Err *err_2;
  char *code;
  Err *err_1;
  uint64_t name;
  char *path_local;
  VM *vm_local;
  
  name_00 = extract_pkg_name(path);
  if (name_00 == 0xffffffffffffffff) {
    vm_local = (VM *)err_new("invalid package name from file path `%s`",path);
    err_file((Err *)vm_local,path);
  }
  else {
    code_00 = read_file(path);
    if (code_00 == (char *)0x0) {
      vm_local = (VM *)err_new("failed to open file `%s`",path);
      err_file((Err *)vm_local,path);
    }
    else {
      pkg_00 = vm_new_pkg(vm,name_00);
      vm_local = (VM *)parse(vm,pkg_00,path,code_00);
      free(code_00);
      if (vm_local == (VM *)0x0) {
        vm_local = (VM *)vm_run(vm,vm->pkgs[pkg_00].main_fn,0);
      }
    }
  }
  return (Err *)vm_local;
}

Assistant:

Err * vm_run_file(VM *vm, char *path) {
	// TODO: save and restore VM state in case of error

	// Extract the package name from the file path
	uint64_t name = extract_pkg_name(path);
	if (name == ~((uint64_t) 0)) {
		Err *err = err_new("invalid package name from file path `%s`", path);
		err_file(err, path);
		return err;
	}

	// Read the file contents
	char *code = read_file(path);
	if (code == NULL) {
		Err *err = err_new("failed to open file `%s`", path);
		err_file(err, path);
		return err;
	}

	// Parse the source code
	int pkg = vm_new_pkg(vm, name);
	Err *err = parse(vm, pkg, path, code);
	free(code);
	if (err != NULL) {
		return err;
	}

	// Run the code
	return vm_run(vm, vm->pkgs[pkg].main_fn, 0);
}